

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

void __thiscall QDockWidgetLayout::~QDockWidgetLayout(QDockWidgetLayout *this)

{
  *(undefined ***)&this->super_QLayout = &PTR_metaObject_007cc1d8;
  (this->super_QLayout).super_QLayoutItem._vptr_QLayoutItem =
       (_func_int **)&PTR__QDockWidgetLayout_007cc2e0;
  qDeleteAll<QList<QLayoutItem*>>(&this->item_list);
  QArrayDataPointer<QLayoutItem_*>::~QArrayDataPointer(&(this->item_list).d);
  QLayout::~QLayout(&this->super_QLayout);
  return;
}

Assistant:

QDockWidgetLayout::~QDockWidgetLayout()
{
    qDeleteAll(item_list);
}